

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall
sing::ThreadPool::
pushTask<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
          (ThreadPool *this,
          _Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
          *task)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = (pthread_mutex_t *)
            (this->pool_).super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               &((this->pool_).
                 super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->tasksQueue,task);
    pthread_mutex_unlock(__mutex);
    std::condition_variable::notify_one();
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void pushTask(F&& task){
        {
            std::lock_guard<std::mutex> lock(pool_->mutex);
            pool_->tasksQueue.emplace(std::forward<F>(task));//使用forward完美转发，保持task原有的右值特征
        }
        pool_->cond.notify_one();;
    }